

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

void lua_pushboolean(lua_State *L,int b)

{
  int iVar1;
  StkId pTVar2;
  int *piVar3;
  
  iVar1 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar1 + 1;
  if (iVar1 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x25f,"void lua_pushboolean(lua_State *, int)");
  }
  pTVar2 = L->top;
  *(uint *)&pTVar2->value_ = (uint)(b != 0);
  pTVar2->tt_ = 1;
  pTVar2 = L->top;
  L->top = pTVar2 + 1;
  if (pTVar2 + 1 <= L->ci->top) {
    piVar3 = *(int **)&L[-1].hookmask;
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      return;
    }
    __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x262,"void lua_pushboolean(lua_State *, int)");
  }
  __assert_fail("(L->top <= L->ci->top) && \"stack overflow\"",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0x261,"void lua_pushboolean(lua_State *, int)");
}

Assistant:

LUA_API void lua_pushboolean (lua_State *L, int b) {
  lua_lock(L);
  setbvalue(L->top, (b != 0));  /* ensure that true is 1 */
  api_incr_top(L);
  lua_unlock(L);
}